

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O2

void addrinfo_sort_list(addrinfo **ailist,_func_int_addrinfo_ptr_addrinfo_ptr *compare)

{
  addrinfo *paVar1;
  addrinfo *paVar2;
  int iVar3;
  addrinfo *paVar4;
  addrinfo *paVar5;
  addrinfo *paVar6;
  addrinfo *paVar7;
  addrinfo *temp;
  addrinfo *paVar8;
  
  paVar6 = (addrinfo *)0x0;
  paVar8 = *ailist;
  while (paVar8 != (addrinfo *)0x0) {
    paVar1 = paVar8->ai_next;
    paVar7 = paVar8;
    if (paVar6 == (addrinfo *)0x0) {
      paVar5 = (addrinfo *)0x0;
    }
    else {
      paVar2 = paVar6;
      paVar4 = (addrinfo *)0x0;
      while ((paVar5 = paVar2, paVar5 != (addrinfo *)0x0 &&
             (iVar3 = (*compare)(paVar8,paVar5), -1 < iVar3))) {
        paVar2 = paVar5->ai_next;
        paVar4 = paVar5;
      }
      if (paVar4 != (addrinfo *)0x0) {
        paVar4->ai_next = paVar8;
        paVar7 = paVar6;
      }
    }
    paVar8->ai_next = paVar5;
    paVar6 = paVar7;
    paVar8 = paVar1;
  }
  *ailist = paVar6;
  return;
}

Assistant:

void addrinfo_sort_list(struct addrinfo **ailist,
    int (*compare)(const struct addrinfo*, const struct addrinfo*))
{
    struct addrinfo *result = NULL, *ai = (*ailist);
    while (ai)
    {
        struct addrinfo *temp = ai;
        ai = ai->ai_next;
        if (result)
        {
            struct addrinfo *ai2 = result, *last = NULL;
            while (ai2 && (compare(temp, ai2) >= 0))
            {
                last = ai2;
                ai2 = ai2->ai_next;
            }
            if (last)
            {
                last->ai_next = temp;
                temp->ai_next = ai2;
            }
            else
            {
                result = temp;
                temp->ai_next = ai2;
            }
        }
        else
        {
            result = temp;
            temp->ai_next = NULL;
        }
    }
    *ailist = result;
}